

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O1

ostream * jsonnet::internal::operator<<(ostream *o,Token *v)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  char *pcVar4;
  
  iVar1 = std::__cxx11::string::compare((char *)&v->data);
  if (iVar1 == 0) {
    pcVar4 = Token::toString(v->kind);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)o + (int)*(undefined8 *)(*(long *)o + -0x18));
      return o;
    }
    sVar3 = strlen(pcVar4);
    poVar2 = o;
  }
  else if (v->kind == OPERATOR) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"\"",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(v->data)._M_dataplus._M_p,(v->data)._M_string_length);
    sVar3 = 1;
    pcVar4 = "\"";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(o,"(",1);
    pcVar4 = Token::toString(v->kind);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)o + (int)*(undefined8 *)(*(long *)o + -0x18));
    }
    else {
      sVar3 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(o,pcVar4,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,", \"",3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(v->data)._M_dataplus._M_p,(v->data)._M_string_length);
    pcVar4 = "\")";
    sVar3 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
  return o;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, const Token &v)
{
    if (v.data == "") {
        o << Token::toString(v.kind);
    } else if (v.kind == Token::OPERATOR) {
        o << "\"" << v.data << "\"";
    } else {
        o << "(" << Token::toString(v.kind) << ", \"" << v.data << "\")";
    }
    return o;
}